

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void cram_init_tables(cram_fd *fd)

{
  int iVar1;
  int local_20;
  uint local_1c;
  int j;
  int g;
  int f;
  int i;
  cram_fd *fd_local;
  
  memset(fd->L1,4,0x100);
  fd->L1[0x41] = '\0';
  fd->L1[0x61] = '\0';
  fd->L1[0x43] = '\x01';
  fd->L1[99] = '\x01';
  fd->L1[0x47] = '\x02';
  fd->L1[0x67] = '\x02';
  fd->L1[0x54] = '\x03';
  fd->L1[0x74] = '\x03';
  memset(fd->L2,5,0x100);
  fd->L2[0x41] = '\0';
  fd->L2[0x61] = '\0';
  fd->L2[0x43] = '\x01';
  fd->L2[99] = '\x01';
  fd->L2[0x47] = '\x02';
  fd->L2[0x67] = '\x02';
  fd->L2[0x54] = '\x03';
  fd->L2[0x74] = '\x03';
  fd->L2[0x4e] = '\x04';
  fd->L2[0x6e] = '\x04';
  if (fd->version >> 8 == 1) {
    for (g = 0; g < 0x200; g = g + 1) {
      j = (int)((g & 0x100U) != 0);
      if ((g & 0x80U) != 0) {
        j = j | 2;
      }
      if ((g & 0x40U) != 0) {
        j = j | 4;
      }
      if ((g & 0x20U) != 0) {
        j = j | 0x10;
      }
      if ((g & 0x10U) != 0) {
        j = j | 0x40;
      }
      if ((g & 8U) != 0) {
        j = j | 0x80;
      }
      if ((g & 4U) != 0) {
        j = j | 0x100;
      }
      if ((g & 2U) != 0) {
        j = j | 0x200;
      }
      if ((g & 1U) != 0) {
        j = j | 0x400;
      }
      fd->bam_flag_swap[g] = j;
    }
    for (g = 0; g < 0x1000; g = g + 1) {
      local_1c = 0;
      if ((g & 1U) != 0) {
        local_1c = 0x100;
      }
      if ((g & 2U) != 0) {
        local_1c = local_1c | 0x80;
      }
      if ((g & 4U) != 0) {
        local_1c = local_1c | 0x40;
      }
      if ((g & 0x10U) != 0) {
        local_1c = local_1c | 0x20;
      }
      if ((g & 0x40U) != 0) {
        local_1c = local_1c | 0x10;
      }
      if ((g & 0x80U) != 0) {
        local_1c = local_1c | 8;
      }
      if ((g & 0x100U) != 0) {
        local_1c = local_1c | 4;
      }
      if ((g & 0x200U) != 0) {
        local_1c = local_1c | 2;
      }
      if ((g & 0x400U) != 0) {
        local_1c = local_1c | 1;
      }
      fd->cram_flag_swap[g] = local_1c;
    }
  }
  else {
    for (g = 0; g < 0x1000; g = g + 1) {
      fd->bam_flag_swap[g] = g;
    }
    for (g = 0; g < 0x1000; g = g + 1) {
      fd->cram_flag_swap[g] = g;
    }
  }
  memset(fd->cram_sub_matrix,4,0x400);
  for (g = 0; g < 0x20; g = g + 1) {
    fd->cram_sub_matrix[g][1] = '\0';
    fd->cram_sub_matrix[g][3] = '\x01';
    fd->cram_sub_matrix[g][7] = '\x02';
    fd->cram_sub_matrix[g][0x14] = '\x03';
    fd->cram_sub_matrix[g][0xe] = '\x04';
  }
  for (g = 0; g < 0x14; g = g + 4) {
    for (local_20 = 0; iVar1 = g >> 2, local_20 < 0x14; local_20 = local_20 + 1) {
      fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)][local_20] = '\x03';
      fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)][local_20] = '\x03';
      fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)][local_20] = '\x03';
      fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)][local_20] = '\x03';
    }
    fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)]
    [(int)((int)"CGTNAGTNACTNACGNACGT"[g] & 0x1f)] = '\0';
    fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)]
    [(int)((int)"CGTNAGTNACTNACGNACGT"[g + 1] & 0x1f)] = '\x01';
    fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)]
    [(int)((int)"CGTNAGTNACTNACGNACGT"[g + 2] & 0x1f)] = '\x02';
    fd->cram_sub_matrix[(int)((int)"ACGTN"[iVar1] & 0x1f)]
    [(int)((int)"CGTNAGTNACTNACGNACGT"[g + 3] & 0x1f)] = '\x03';
  }
  return;
}

Assistant:

static void cram_init_tables(cram_fd *fd) {
    int i;

    memset(fd->L1, 4, 256);
    fd->L1['A'] = 0; fd->L1['a'] = 0;
    fd->L1['C'] = 1; fd->L1['c'] = 1;
    fd->L1['G'] = 2; fd->L1['g'] = 2;
    fd->L1['T'] = 3; fd->L1['t'] = 3;

    memset(fd->L2, 5, 256);
    fd->L2['A'] = 0; fd->L2['a'] = 0;
    fd->L2['C'] = 1; fd->L2['c'] = 1;
    fd->L2['G'] = 2; fd->L2['g'] = 2;
    fd->L2['T'] = 3; fd->L2['t'] = 3;
    fd->L2['N'] = 4; fd->L2['n'] = 4;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	for (i = 0; i < 0x200; i++) {
	    int f = 0;

	    if (i & CRAM_FPAIRED)      f |= BAM_FPAIRED;
	    if (i & CRAM_FPROPER_PAIR) f |= BAM_FPROPER_PAIR;
	    if (i & CRAM_FUNMAP)       f |= BAM_FUNMAP;
	    if (i & CRAM_FREVERSE)     f |= BAM_FREVERSE;
	    if (i & CRAM_FREAD1)       f |= BAM_FREAD1;
	    if (i & CRAM_FREAD2)       f |= BAM_FREAD2;
	    if (i & CRAM_FSECONDARY)   f |= BAM_FSECONDARY;
	    if (i & CRAM_FQCFAIL)      f |= BAM_FQCFAIL;
	    if (i & CRAM_FDUP)         f |= BAM_FDUP;

	    fd->bam_flag_swap[i]  = f;
	}
    
	for (i = 0; i < 0x1000; i++) {
	    int g = 0;

	    if (i & BAM_FPAIRED)	   g |= CRAM_FPAIRED;
	    if (i & BAM_FPROPER_PAIR)  g |= CRAM_FPROPER_PAIR;
	    if (i & BAM_FUNMAP)        g |= CRAM_FUNMAP;
	    if (i & BAM_FREVERSE)      g |= CRAM_FREVERSE;
	    if (i & BAM_FREAD1)        g |= CRAM_FREAD1;
	    if (i & BAM_FREAD2)        g |= CRAM_FREAD2;
	    if (i & BAM_FSECONDARY)    g |= CRAM_FSECONDARY;
	    if (i & BAM_FQCFAIL)       g |= CRAM_FQCFAIL;
	    if (i & BAM_FDUP)          g |= CRAM_FDUP;

	    fd->cram_flag_swap[i] = g;
	}
    } else {
	/* NOP */
	for (i = 0; i < 0x1000; i++)
	    fd->bam_flag_swap[i] = i;
	for (i = 0; i < 0x1000; i++)
	    fd->cram_flag_swap[i] = i;
    }

    memset(fd->cram_sub_matrix, 4, 32*32);
    for (i = 0; i < 32; i++) {
	fd->cram_sub_matrix[i]['A'&0x1f]=0;
	fd->cram_sub_matrix[i]['C'&0x1f]=1;
	fd->cram_sub_matrix[i]['G'&0x1f]=2;
	fd->cram_sub_matrix[i]['T'&0x1f]=3;
	fd->cram_sub_matrix[i]['N'&0x1f]=4;
    }
    for (i = 0; i < 20; i+=4) {
	int j;
	for (j = 0; j < 20; j++) {
	    fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][j]=3;
	    fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][j]=3;
	    fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][j]=3;
	    fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][j]=3;
	}
	fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][CRAM_SUBST_MATRIX[i+0]&0x1f]=0;
	fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][CRAM_SUBST_MATRIX[i+1]&0x1f]=1;
	fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][CRAM_SUBST_MATRIX[i+2]&0x1f]=2;
	fd->cram_sub_matrix["ACGTN"[i>>2]&0x1f][CRAM_SUBST_MATRIX[i+3]&0x1f]=3;
    }
}